

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowDistinctAggregatorGlobalState::PatchPrevIdcs
          (WindowDistinctAggregatorGlobalState *this)

{
  ulong __n;
  size_type __n_00;
  unsigned_long uVar1;
  Elements *this_00;
  reference pvVar2;
  size_type __n_01;
  
  this_00 = MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
            ::LowestLevel(&this->zipped_tree);
  __n = 0;
  while (__n_01 = __n, __n = __n_01 + 1,
        __n < (ulong)((long)(this->seconds).
                            super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                            .
                            super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->seconds).
                            super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                            .
                            super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    pvVar2 = ::std::
             vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
             ::at(&(this->seconds).
                   super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                  ,__n);
    __n_00 = (pvVar2->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
             super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    pvVar2 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::get<true>(this_00,__n_00);
    if ((pvVar2->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
        super__Head_base<0UL,_unsigned_long,_false>._M_head_impl != 0) {
      pvVar2 = ::std::
               vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
               ::at(&(this->seconds).
                     super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                    ,__n_01);
      uVar1 = (pvVar2->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
              super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
              _M_head_impl;
      pvVar2 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::get<true>(this_00,__n_00);
      (pvVar2->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar1 + 1;
      (pvVar2->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = __n_00;
    }
  }
  return;
}

Assistant:

void WindowDistinctAggregatorGlobalState::PatchPrevIdcs() {
	//	13:	return prevIdcs

	// Patch up the indices at block boundaries
	// (We don't need to patch block 0.)
	auto &prev_idcs = zipped_tree.LowestLevel();
	for (idx_t block_idx = 1; block_idx < seconds.size(); ++block_idx) {
		// We only need to patch if the first index in the block
		// was a back link to the previous block (10:)
		auto i = std::get<0>(seconds.at(block_idx));
		if (std::get<0>(prev_idcs[i])) {
			auto second = std::get<1>(seconds.at(block_idx - 1));
			prev_idcs[i] = ZippedTuple(second + 1, i);
		}
	}
}